

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie.cc
# Opt level: O0

void hbtrie_init(hbtrie *trie,int chunksize,int valuelen,int btree_nodesize,bid_t root_bid,
                void *btreeblk_handle,btree_blk_ops *btree_blk_ops,void *doc_handle,
                hbtrie_func_readkey *readkey)

{
  btree_kv_ops *pbVar1;
  void *pvVar2;
  undefined4 in_ECX;
  int in_EDX;
  uint in_ESI;
  undefined1 *in_RDI;
  undefined8 in_R8;
  uint64_t in_R9;
  btree_kv_ops *btree_leaf_kv_ops;
  btree_kv_ops *btree_kv_ops;
  btree_kv_ops *local_38;
  int line;
  undefined4 in_stack_ffffffffffffffe8;
  
  *in_RDI = (char)in_ESI;
  in_RDI[1] = (char)in_EDX;
  *(undefined4 *)(in_RDI + 4) = in_ECX;
  *(btree_kv_ops **)(in_RDI + 0x28) = btree_kv_ops;
  *(uint64_t *)(in_RDI + 0x10) = in_R9;
  *(void **)(in_RDI + 0x18) = btreeblk_handle;
  *(undefined8 *)(in_RDI + 8) = in_R8;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[0x60] = (char)in_ESI;
  *(undefined8 *)(in_RDI + 0x50) = 0;
  *(undefined8 *)(in_RDI + 0x58) = 0;
  *(undefined1 **)(in_RDI + 0x20) = in_RDI + 0x50;
  pbVar1 = (btree_kv_ops *)malloc(0x78);
  line = (int)((ulong)in_R8 >> 0x20);
  malloc(0x78);
  if (in_EDX != 8) {
    fdb_assert_die((char *)CONCAT44(in_ESI,in_EDX),
                   (char *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),line,in_R9,(uint64_t)pbVar1);
  }
  if (in_ESI < 8) {
    fdb_assert_die((char *)CONCAT44(in_ESI,in_EDX),
                   (char *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),line,in_R9,(uint64_t)pbVar1);
  }
  if ((in_ESI == 8) && (in_EDX == 8)) {
    pbVar1 = btree_kv_get_kb64_vb64(pbVar1);
    local_38 = btree_fast_str_kv_get_kb64_vb64(pbVar1);
  }
  else if ((in_ESI == 4) && (in_EDX == 8)) {
    pbVar1 = btree_kv_get_kb32_vb64(pbVar1);
    local_38 = btree_fast_str_kv_get_kb64_vb64(pbVar1);
  }
  else {
    pbVar1 = btree_kv_get_kbn_vb64(pbVar1);
    local_38 = btree_fast_str_kv_get_kb64_vb64(pbVar1);
  }
  *(btree_kv_ops **)(in_RDI + 0x30) = pbVar1;
  *(btree_kv_ops **)(in_RDI + 0x38) = local_38;
  *(bid_t *)(in_RDI + 0x40) = root_bid;
  *(undefined8 *)(in_RDI + 0x48) = 0;
  pvVar2 = malloc((long)(int)in_ESI);
  *(void **)(in_RDI + 0x68) = pvVar2;
  memset(*(void **)(in_RDI + 0x68),0xff,(long)(int)in_ESI);
  return;
}

Assistant:

void hbtrie_init(struct hbtrie *trie, int chunksize, int valuelen,
                 int btree_nodesize, bid_t root_bid, void *btreeblk_handle,
                 struct btree_blk_ops *btree_blk_ops, void *doc_handle,
                 hbtrie_func_readkey *readkey)
{
    struct btree_kv_ops *btree_kv_ops, *btree_leaf_kv_ops;

    trie->chunksize = chunksize;
    trie->valuelen = valuelen;
    trie->btree_nodesize = btree_nodesize;
    trie->btree_blk_ops = btree_blk_ops;
    trie->btreeblk_handle = btreeblk_handle;
    trie->doc_handle = doc_handle;
    trie->root_bid = root_bid;
    trie->flag = 0x0;
    trie->leaf_height_limit = 0;
    trie->cmp_args.chunksize = chunksize;
    trie->cmp_args.cmp_func = NULL;
    trie->cmp_args.user_param = NULL;
    trie->aux = &trie->cmp_args;

    // assign key-value operations
    btree_kv_ops = (struct btree_kv_ops *)malloc(sizeof(struct btree_kv_ops));
    btree_leaf_kv_ops = (struct btree_kv_ops *)malloc(sizeof(struct btree_kv_ops));

    fdb_assert(valuelen == 8, valuelen, trie);
    fdb_assert((size_t)chunksize >= sizeof(void *), chunksize, trie);

    if (chunksize == 8 && valuelen == 8){
        btree_kv_ops = btree_kv_get_kb64_vb64(btree_kv_ops);
        btree_leaf_kv_ops = _get_leaf_kv_ops(btree_leaf_kv_ops);
    } else if (chunksize == 4 && valuelen == 8) {
        btree_kv_ops = btree_kv_get_kb32_vb64(btree_kv_ops);
        btree_leaf_kv_ops = _get_leaf_kv_ops(btree_leaf_kv_ops);
    } else {
        btree_kv_ops = btree_kv_get_kbn_vb64(btree_kv_ops);
        btree_leaf_kv_ops = _get_leaf_kv_ops(btree_leaf_kv_ops);
    }

    trie->btree_kv_ops = btree_kv_ops;
    trie->btree_leaf_kv_ops = btree_leaf_kv_ops;
    trie->readkey = readkey;
    trie->map = NULL;
    trie->last_map_chunk = (void *)malloc(chunksize);
    memset(trie->last_map_chunk, 0xff, chunksize); // set 0xffff...
}